

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo.cpp
# Opt level: O1

int __thiscall CDemoPlayer::Stop(CDemoPlayer *this)

{
  int iVar1;
  
  if (this->m_File == (IOHANDLE)0x0) {
    iVar1 = -1;
  }
  else {
    iVar1 = 0;
    (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
              (this->m_pConsole,0,"demo_player","Stopped playback",0);
    io_close(this->m_File);
    this->m_File = (IOHANDLE)0x0;
    mem_free(this->m_pKeyFrames);
    this->m_pKeyFrames = (CKeyFrame *)0x0;
    this->m_aFilename[0] = '\0';
  }
  return iVar1;
}

Assistant:

int CDemoPlayer::Stop()
{
	if(!m_File)
		return -1;

	m_pConsole->Print(IConsole::OUTPUT_LEVEL_STANDARD, "demo_player", "Stopped playback");
	io_close(m_File);
	m_File = 0;
	mem_free(m_pKeyFrames);
	m_pKeyFrames = 0;
	m_aFilename[0] = '\0';
	return 0;
}